

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cpp
# Opt level: O2

GF2E __thiscall field::GF2E::inverse(GF2E *this)

{
  long lVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  GF2E GVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  bool bVar15;
  undefined1 in_XMM0 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  uVar12 = this->data;
  if (msb == '\0') {
    GVar7.data = 0;
    uVar9 = 1;
    uVar11 = modulus;
    while (uVar10 = uVar12, uVar10 != 0) {
      lVar1 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      uVar13 = 0;
      for (uVar12 = uVar11; uVar12 != 0; uVar12 = uVar12 ^ uVar10 << ((byte)uVar8 & 0x3f)) {
        lVar2 = 0x3f;
        if (uVar12 != 0) {
          for (; uVar12 >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        uVar8 = ((uint)lVar1 ^ 0x3f) - ((uint)lVar2 ^ 0x3f);
        if ((int)uVar8 < 0) break;
        uVar13 = uVar13 | 1L << ((ulong)uVar8 & 0x3f);
      }
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uVar10;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar13;
      auVar16 = (undefined1  [16])0x0;
      for (uVar8 = 0; uVar8 < 0x40; uVar8 = uVar8 + 1) {
        if ((auVar19 & (undefined1  [16])0x1 << uVar8) != (undefined1  [16])0x0) {
          auVar16 = auVar16 ^ auVar4 << uVar8;
        }
      }
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar9;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar13;
      auVar19 = (undefined1  [16])0x0;
      for (uVar8 = 0; uVar8 < 0x40; uVar8 = uVar8 + 1) {
        if ((auVar3 & (undefined1  [16])0x1 << uVar8) != (undefined1  [16])0x0) {
          auVar19 = auVar19 ^ auVar5 << uVar8;
        }
      }
      uVar12 = auVar19._0_8_ ^ GVar7.data;
      GVar7.data = uVar9;
      uVar9 = uVar12;
      uVar12 = auVar16._0_8_ ^ uVar11;
      uVar11 = uVar10;
    }
  }
  else {
    if (uVar12 != 1) {
      auVar16 = pmovsxbq(in_XMM0,0x101);
      auVar16._0_8_ = uVar12;
      bVar14 = true;
      bVar15 = false;
      auVar19 = (undefined1  [16])0x0;
      do {
        if ((auVar19._0_8_ == 0) && (!bVar14)) {
          return (GF2E)auVar16._8_8_;
        }
        while ((auVar19 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          auVar20._0_8_ = (ulong)bVar14 << 0x3f;
          auVar20._8_8_ = auVar19._8_8_ << 0x3f;
          auVar18._0_8_ = auVar19._0_8_ >> 1;
          auVar18._8_8_ = auVar19._8_8_ >> 1;
          bVar14 = false;
          auVar19 = auVar18 | auVar20;
        }
        while (uVar12 = auVar16._0_8_, (auVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          if ((uVar12 == 0) && (bVar15 == false)) {
            bVar15 = false;
            break;
          }
          auVar21._0_8_ = (ulong)bVar15 << 0x3f;
          auVar21._8_8_ = auVar16._8_8_ << 0x3f;
          auVar17._0_8_ = uVar12 >> 1;
          auVar17._8_8_ = auVar16._8_8_ >> 1;
          bVar15 = false;
          auVar16 = auVar17 | auVar21;
        }
        bVar6 = bVar15 < bVar14;
        if (bVar14 == bVar15) {
          bVar6 = uVar12 <= auVar19._0_8_;
        }
        if (bVar6) {
          bVar14 = bVar14 != bVar15;
          auVar19 = auVar16 ^ auVar19;
        }
        else {
          bVar15 = bVar15 != bVar14;
          auVar16 = auVar16 ^ auVar19;
        }
      } while( true );
    }
    GVar7.data = 1;
  }
  return (GF2E)GVar7.data;
}

Assistant:

GF2E GF2E::inverse() const { return GF2E(mod_inverse(this->data, modulus, msb)); }